

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_ObjectRenderingAttributes::IsValid(ON_ObjectRenderingAttributes *this,ON_TextLog *text_log)

{
  int iVar1;
  ON_MappingRef *pOVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ON_MappingRef *pOVar8;
  ON_MappingRef *pOVar9;
  ulong uVar10;
  ON_UUID plugin_id;
  ON_UUID local_48;
  
  bVar4 = ON_RenderingAttributes::IsValid(&this->super_ON_RenderingAttributes,text_log);
  if (bVar4) {
    iVar1 = (this->m_mappings).m_count;
    bVar4 = true;
    if (1 < iVar1) {
      pOVar2 = (this->m_mappings).m_a;
      uVar3 = 0;
      pOVar8 = pOVar2;
      while (uVar10 = uVar3, pOVar8 = pOVar8 + 1, uVar10 != iVar1 - 1) {
        pOVar9 = pOVar2 + uVar10;
        local_48.Data1 = (pOVar9->m_plugin_id).Data1;
        local_48.Data2 = (pOVar9->m_plugin_id).Data2;
        local_48.Data3 = (pOVar9->m_plugin_id).Data3;
        local_48.Data4 = *&(pOVar9->m_plugin_id).Data4;
        uVar7 = uVar10 & 0xffffffff;
        pOVar9 = pOVar8;
        while (uVar6 = (int)uVar7 + 1, uVar7 = (ulong)uVar6, uVar3 = uVar10 + 1, (int)uVar6 < iVar1)
        {
          iVar5 = ON_UuidCompare(&local_48,&pOVar9->m_plugin_id);
          pOVar9 = pOVar9 + 1;
          if (iVar5 == 0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,
                                "ON_ObjectRenderingAttributes error: m_mappings[%d] and m_mappings[%d] have the same plug-in id.\n"
                                ,uVar10 & 0xffffffff,uVar7);
            }
            goto LAB_004f9721;
          }
        }
      }
    }
  }
  else {
LAB_004f9721:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_ObjectRenderingAttributes::IsValid( ON_TextLog* text_log ) const
{
  if ( !ON_RenderingAttributes::IsValid(text_log) )
    return false;

  // plug-in uuids must be unique
  int count;
  if( (count = m_mappings.Count()) > 1 )
  {
    const ON_MappingRef* mr = m_mappings.Array();
    ON_UUID plugin_id;
    int i, j;
    for ( i = 0; i < count-1; i++ )
    {
      plugin_id = mr[i].m_plugin_id;
      for ( j = i+1; j < count; j++ )
      {
        if ( !ON_UuidCompare(&plugin_id,&mr[j].m_plugin_id ) )
        {
          if( text_log )
          {
            text_log->Print("ON_ObjectRenderingAttributes error: m_mappings[%d] and m_mappings[%d] have the same plug-in id.\n",i,j);
          }
          return false;
        }
      }
    }
  }

  return true;
}